

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::InstrumentPass::GetUintId(InstrumentPass *this)

{
  uint32_t uVar1;
  TypeManager *this_00;
  Type *type;
  Integer uint_ty;
  Type local_48;
  undefined1 local_20;
  
  if (this->uint_id_ != 0) {
    return this->uint_id_;
  }
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  local_48.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.kind_ = kInteger;
  local_48._36_4_ = 0x20;
  local_48._vptr_Type = (_func_int **)&PTR__Type_003b18d0;
  local_20 = 0;
  type = analysis::TypeManager::GetRegisteredType(this_00,&local_48);
  uVar1 = analysis::TypeManager::GetTypeInstruction(this_00,type);
  this->uint_id_ = uVar1;
  analysis::Type::~Type(&local_48);
  return this->uint_id_;
}

Assistant:

uint32_t InstrumentPass::GetUintId() {
  if (uint_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Integer uint_ty(32, false);
    analysis::Type* reg_uint_ty = type_mgr->GetRegisteredType(&uint_ty);
    uint_id_ = type_mgr->GetTypeInstruction(reg_uint_ty);
  }
  return uint_id_;
}